

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shake.cpp
# Opt level: O3

int __thiscall OpenMD::Shake::constraintPairF(Shake *this,ConstraintPair *consPair)

{
  double *pdVar1;
  double dVar2;
  ConstraintElem *pCVar3;
  ConstraintElem *pCVar4;
  StuntDouble *pSVar5;
  StuntDouble *pSVar6;
  uint i;
  int iVar7;
  long lVar8;
  double tmp;
  double dVar9;
  double tmp_2;
  double tmp_1;
  Vector<double,_3U> result_1;
  Vector<double,_3U> result;
  Vector<double,_3U> result_3;
  Vector<double,_3U> result_2;
  double local_148 [4];
  double local_128 [4];
  double local_108 [4];
  double local_e8;
  double local_e0;
  double local_d8 [4];
  Vector3d local_b8;
  double local_98 [4];
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58 [4];
  double local_38 [3];
  
  pCVar3 = consPair->consElem1_;
  pCVar4 = consPair->consElem2_;
  pSVar5 = pCVar3->sd_;
  lVar8 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data + pSVar5->storage_);
  local_38[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar8 + (long)pSVar5->localIndex_ * 0x18);
  local_38[0] = *pdVar1;
  local_38[1] = pdVar1[1];
  pSVar5 = pCVar4->sd_;
  lVar8 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).position.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
  local_58[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar8 + (long)pSVar5->localIndex_ * 0x18);
  local_58[0] = *pdVar1;
  local_58[1] = pdVar1[1];
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_128[2] = 0.0;
  lVar8 = 0;
  do {
    local_128[lVar8] = local_38[lVar8] - local_58[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_b8.super_Vector<double,_3U>.data_[2] = local_128[2];
  local_b8.super_Vector<double,_3U>.data_[0] = local_128[0];
  local_b8.super_Vector<double,_3U>.data_[1] = local_128[1];
  Snapshot::wrapVector(this->currentSnapshot_,&local_b8);
  pSVar5 = pCVar3->sd_;
  lVar8 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).force.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data + pSVar5->storage_);
  local_128[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar5->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar8 + (long)pSVar5->localIndex_ * 0x18);
  local_128[0] = *pdVar1;
  local_128[1] = pdVar1[1];
  pSVar6 = pCVar4->sd_;
  lVar8 = *(long *)((long)&(pSVar6->snapshotMan_->currentSnapshot_->atomData).force.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + pSVar6->storage_);
  local_108[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)pSVar6->localIndex_ * 0x18);
  pdVar1 = (double *)(lVar8 + (long)pSVar6->localIndex_ * 0x18);
  local_108[0] = *pdVar1;
  local_108[1] = pdVar1[1];
  local_e0 = 1.0 / pSVar5->mass_;
  local_e8 = pSVar6->mass_;
  local_148[0] = 0.0;
  local_148[1] = 0.0;
  local_148[2] = 0.0;
  lVar8 = 0;
  do {
    local_148[lVar8] = local_128[lVar8] * local_e0;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_e8 = 1.0 / local_e8;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  lVar8 = 0;
  do {
    local_98[lVar8] = local_108[lVar8] * local_e8;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_d8[0] = 0.0;
  local_d8[1] = 0.0;
  local_d8[2] = 0.0;
  lVar8 = 0;
  do {
    local_d8[lVar8] = local_148[lVar8] - local_98[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  dVar9 = 0.0;
  lVar8 = 0;
  do {
    dVar9 = dVar9 + local_d8[lVar8] * local_d8[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_108[3] = 0.0;
  lVar8 = 0;
  do {
    dVar2 = local_b8.super_Vector<double,_3U>.data_[lVar8];
    local_108[3] = local_108[3] + dVar2 * dVar2;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  local_68 = 0.0;
  lVar8 = 0;
  do {
    local_68 = local_68 + local_b8.super_Vector<double,_3U>.data_[lVar8] * local_d8[lVar8];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  dVar2 = 1.0;
  if (1.0 <= dVar9) {
    dVar2 = dVar9;
  }
  local_78 = ABS(local_68);
  dVar2 = dVar2 * local_108[3];
  if (dVar2 < 0.0) {
    uStack_60 = 0;
    uStack_70 = 0;
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  iVar7 = 1;
  if (dVar2 * this->consTolerance_ < local_78) {
    dVar9 = -local_68 / ((local_e0 + local_e8) * local_108[3]);
    local_148[0] = 0.0;
    local_148[1] = 0.0;
    local_148[2] = 0.0;
    lVar8 = 0;
    do {
      local_148[lVar8] = local_b8.super_Vector<double,_3U>.data_[lVar8] * dVar9;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar8 = 0;
    do {
      local_128[lVar8] = local_148[lVar8] + local_128[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    local_148[0] = 0.0;
    local_148[1] = 0.0;
    local_148[2] = 0.0;
    lVar8 = 0;
    do {
      local_148[lVar8] = local_b8.super_Vector<double,_3U>.data_[lVar8] * dVar9;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    lVar8 = 0;
    do {
      local_108[lVar8] = local_108[lVar8] - local_148[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    pSVar5 = pCVar3->sd_;
    iVar7 = pSVar5->localIndex_;
    lVar8 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).force.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data + pSVar5->storage_);
    *(double *)(lVar8 + 0x10 + (long)iVar7 * 0x18) = local_128[2];
    pdVar1 = (double *)(lVar8 + (long)iVar7 * 0x18);
    *pdVar1 = local_128[0];
    pdVar1[1] = local_128[1];
    pSVar5 = pCVar4->sd_;
    iVar7 = pSVar5->localIndex_;
    lVar8 = *(long *)((long)&(pSVar5->snapshotMan_->currentSnapshot_->atomData).force.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + pSVar5->storage_);
    *(double *)(lVar8 + 0x10 + (long)iVar7 * 0x18) = local_108[2];
    pdVar1 = (double *)(lVar8 + (long)iVar7 * 0x18);
    *pdVar1 = local_108[0];
    pdVar1[1] = local_108[1];
    consPair->force_ = dVar9;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

int Shake::constraintPairF(ConstraintPair* consPair) {
    ConstraintElem* consElem1 = consPair->getConsElem1();
    ConstraintElem* consElem2 = consPair->getConsElem2();

    Vector3d posA = consElem1->getPos();
    Vector3d posB = consElem2->getPos();

    Vector3d rab = posA - posB;

    currentSnapshot_->wrapVector(rab);

    Vector3d frcA = consElem1->getFrc();
    Vector3d frcB = consElem2->getFrc();

    RealType rma = 1.0 / consElem1->getMass();
    RealType rmb = 1.0 / consElem2->getMass();

    Vector3d fpab = frcA * rma - frcB * rmb;

    RealType gab = fpab.lengthSquare();
    if (gab < 1.0) gab = 1.0;

    RealType rabsq = rab.lengthSquare();
    RealType rfab  = dot(rab, fpab);

    if (fabs(rfab) > sqrt(rabsq * gab) * consTolerance_) {
      gab = -rfab / (rabsq * (rma + rmb));

      frcA += rab * gab;
      frcB -= rab * gab;

      consElem1->setFrc(frcA);
      consElem2->setFrc(frcB);

      // report the constraint force back to the constraint pair:
      consPair->setConstraintForce(gab);
      return consSuccess;
    } else
      return consAlready;
  }